

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O2

void Gia_CollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  int Entry;
  uint uVar1;
  
  while( true ) {
    if ((((ulong)pObj & 1) != 0) || (uVar1 = (uint)*(undefined8 *)pObj, (~uVar1 & 0x9fffffff) == 0))
    {
      Entry = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe));
      Vec_IntPushUnique(vSuper,Entry);
      return;
    }
    if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) break;
    Gia_CollectSuper_rec
              (p,(Gia_Obj_t *)
                 ((ulong)(uVar1 >> 0x1d & 1) | (ulong)(pObj + -(ulong)(uVar1 & 0x1fffffff))),vSuper)
    ;
    pObj = Gia_ObjChild1(pObj);
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEnable.c"
                ,0x35,"void Gia_CollectSuper_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects the supergate.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_CollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_Regular(pObj)) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    // go through the branches
    Gia_CollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper );
    Gia_CollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper );
}